

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  _Rb_tree_node_base *p_Var4;
  char *__s;
  size_t sVar5;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  __node_base _Var9;
  sockaddr_in address;
  termios newTermios;
  termios origTermios;
  undefined1 local_259;
  sockaddr_in local_258;
  char **local_248;
  ulong local_240;
  undefined1 local_238 [32];
  pointer pcStack_218;
  speed_t sStack_204;
  speed_t sStack_200;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0 [4];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  
  iVar2 = 1;
  local_248 = argv;
  bVar1 = ssl::initialize();
  if (bVar1) {
    if ((main::categories_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&main::categories_abi_cxx11_), iVar2 != 0)) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_const_char_(&)[58],_true>
                (local_1f0,(char (*) [10])"--sponsor",
                 (char (*) [58])"Paid promotion, paid referrals and direct advertisements.");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[12],_const_char_(&)[123],_true>
                (local_1f0 + 1,(char (*) [12])"--selfpromo",
                 (char (*) [123])
                 "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with."
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_const_char_(&)[70],_true>
                (local_1f0 + 2,(char (*) [14])"--interaction",
                 (char (*) [70])
                 "Reminders to like, subscribe or follow them in the middle of content.");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[121],_true>
                (local_1f0 + 3,(char (*) [8])"--intro",
                 (char (*) [121])
                 "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information."
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[79],_true>
                (&local_f0,(char (*) [8])"--outro",
                 (char (*) [79])
                 "Credits or when the YouTube endcards appear. Not conclusions with information.");
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_const_char_(&)[140],_true>
                (&local_b0,(char (*) [10])"--preview",
                 (char (*) [140])
                 "Quick recap of previous episodes, or a preview of what\'s coming up later in the current video. Edited together clips, not spoken summaries."
                );
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[17],_const_char_(&)[106],_true>
                (&local_70,(char (*) [17])"--music_offtopic",
                 (char (*) [106])
                 "Only in music videos. Non-music sections of music videos that aren\'t already covered by another category."
                );
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&main::categories_abi_cxx11_,local_1f0,&stack0xffffffffffffffd0,0,local_238,
                 &local_258,&local_259);
      lVar8 = 0x180;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&local_1f0[0].first._M_dataplus._M_p + lVar8));
        lVar8 = lVar8 + -0x40;
      } while (lVar8 != -0x40);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&main::categories_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&main::categories_abi_cxx11_);
    }
    if (1 < argc) {
      uVar7 = 1;
      local_240 = (ulong)(uint)argc;
      do {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1f0,local_248[uVar7],(allocator<char> *)local_238);
        iVar2 = std::__cxx11::string::compare((char *)local_1f0);
        if ((iVar2 == 0) || (iVar2 = std::__cxx11::string::compare((char *)local_1f0), iVar2 == 0))
        {
          s_verbose = 1;
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)local_1f0);
          _Var9 = main::categories_abi_cxx11_._M_h._M_before_begin;
          if (iVar2 == 0) {
            for (; _Var9._M_nxt != (_Hash_node_base *)0x0; _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
              std::__cxx11::string::substr((ulong)local_238,(ulong)(_Var9._M_nxt + 1));
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&s_categories_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238);
              if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
            }
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)local_1f0);
            if ((iVar2 == 0) ||
               (iVar2 = std::__cxx11::string::compare((char *)local_1f0), iVar2 == 0)) {
              s_adblock = 1;
            }
            else {
              cVar3 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(&main::categories_abi_cxx11_._M_h,&local_1f0[0].first);
              if (cVar3.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                  ._M_cur == (__node_type *)0x0) {
                printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n",*local_248);
                puts(
                    "You may also specify which categories you want to skip, defaults to just sponsors:"
                    );
                for (_Var9 = main::categories_abi_cxx11_._M_h._M_before_begin;
                    _Var9._M_nxt != (_Hash_node_base *)0x0; _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt) {
                  printf("  %s: %s\n",_Var9._M_nxt[1]._M_nxt,_Var9._M_nxt[5]._M_nxt);
                }
                puts("\n--adblock is basically untested and might not work, hence not on by default"
                    );
                exit(0x16);
              }
              std::__cxx11::string::substr((ulong)local_238,(ulong)local_1f0);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&s_categories_abi_cxx11_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_238);
              if ((undefined1 *)local_238._0_8_ != local_238 + 0x10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0[0].first._M_dataplus._M_p != &local_1f0[0].first.field_2) {
          operator_delete(local_1f0[0].first._M_dataplus._M_p,
                          local_1f0[0].first.field_2._M_allocated_capacity + 1);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != local_240);
    }
    if (s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      printf("  Skipping these categories: ");
      p_Var4 = s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((_Rb_tree_header *)
          s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
          &s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        do {
          printf("%s ",*(undefined8 *)(p_Var4 + 1));
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        } while ((_Rb_tree_header *)p_Var4 !=
                 &s_categories_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
      }
      putchar(10);
    }
    signal(2,signalHandler);
    signal(0xf,signalHandler);
    signal(3,signalHandler);
    tcgetattr(0,(termios *)local_1f0);
    local_238._0_8_ = local_1f0[0].first._M_dataplus._M_p;
    sStack_204 = local_1f0[0].second.field_2._4_4_;
    sStack_200 = local_1f0[0].second.field_2._8_4_;
    pcStack_218 = local_1f0[0].second._M_dataplus._M_p;
    local_238._16_8_ = local_1f0[0].first.field_2._M_allocated_capacity;
    local_238._24_8_ = local_1f0[0].first.field_2._8_8_;
    local_238._8_8_ = local_1f0[0].first._M_string_length & 0xfffffff5ffffffff;
    tcsetattr(0,0,(termios *)local_238);
    iVar2 = 0;
    do {
      if (s_running != '\0') break;
      s_currentPosition = -1.0;
      nextSegmentStart = -1.0;
      s_lastPositionFetched = -1.0;
      std::__cxx11::string::_M_replace
                (0x12a840,0,(char *)currentVideo_abi_cxx11_._M_string_length,0x11ed53);
      std::__cxx11::string::_M_replace(0x12a900,0,DAT_0012a908,0x11ed53);
      std::__cxx11::string::_M_replace(0x12a8e0,0,DAT_0012a8e8,0x11ed53);
      if (iVar2 != 0) {
        puts("Disconnected, sleeping and re-connecting");
        sleep(10);
      }
      local_258.sin_family = 0;
      local_258.sin_port = 0;
      local_258.sin_addr.s_addr = 0;
      local_258.sin_zero[0] = '\0';
      local_258.sin_zero[1] = '\0';
      local_258.sin_zero[2] = '\0';
      local_258.sin_zero[3] = '\0';
      local_258.sin_zero[4] = '\0';
      local_258.sin_zero[5] = '\0';
      local_258.sin_zero[6] = '\0';
      local_258.sin_zero[7] = '\0';
      iVar2 = mdns::openSocket();
      if ((iVar2 < 0) || (bVar1 = mdns::sendRequest(iVar2), !bVar1)) {
LAB_0010b78d:
        printf("\x1b[?25l");
        std::__cxx11::string::_M_replace
                  (0x12a860,0,(char *)s_currentStatus_abi_cxx11_._M_string_length,0x11ecce);
        iVar2 = loop(&local_258);
        bVar1 = true;
      }
      else {
        bVar1 = mdns::query(iVar2,&local_258);
        close(iVar2);
        if (bVar1) {
          local_258.sin_port = 0x491f;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Found chromecast: ",0x12);
          __s = inet_ntoa((in_addr)local_258.sin_addr.s_addr);
          if (__s == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b308);
          }
          else {
            sVar5 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
          }
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
          std::ostream::put('\b');
          std::ostream::flush();
        }
        else {
          piVar6 = __errno_location();
          if (*piVar6 != 0) {
            perror("Failed to find chromecast");
          }
        }
        if (bVar1) goto LAB_0010b78d;
        iVar2 = 2;
        bVar1 = false;
      }
    } while (bVar1);
    printf("\x1b[?25h");
    tcsetattr(0,0,(termios *)local_1f0);
  }
  return iVar2;
}

Assistant:

int main(int argc, char *argv[])
{
    if (!ssl::initialize()) {
        return 1;
    }
    static std::unordered_map<std::string, std::string> categories = {
        { "--sponsor", "Paid promotion, paid referrals and direct advertisements." },
        { "--selfpromo", "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with." },
        { "--interaction", "Reminders to like, subscribe or follow them in the middle of content." },
        { "--intro", "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information." },
        { "--outro", "Credits or when the YouTube endcards appear. Not conclusions with information." },
        { "--preview", "Quick recap of previous episodes, or a preview of what's coming up later in the current video. Edited together clips, not spoken summaries." },
        { "--music_offtopic", "Only in music videos. Non-music sections of music videos that aren't already covered by another category." },
    };
    for (int i=1; i<argc; i++) {
        const std::string arg = argv[i];
        if (arg == "-v" || arg == "--verbose") {
            s_verbose = true;
        } else if (arg == "--all-categories") {
            for (const std::pair<const std::string, std::string> &category : categories) {
                s_categories.insert(category.first.substr(2));
            }
        } else if (arg == "-a" || arg == "--adblock") {
            s_adblock = true;
        } else if (categories.count(arg)) {
            s_categories.insert(arg.substr(2));
        } else {
            printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n", argv[0]);
            puts("You may also specify which categories you want to skip, defaults to just sponsors:");
            for (const std::pair<const std::string, std::string> &category : categories) {
                printf("  %s: %s\n", category.first.c_str(), category.second.c_str());
            }
            puts("\n--adblock is basically untested and might not work, hence not on by default");
            exit(EINVAL);
        }
    }
    if (!s_categories.empty()) {
        printf("  Skipping these categories: ");
        for (const std::string &category : s_categories) {
            printf("%s ", category.c_str());
        }
        puts("");
    }
    signal(SIGINT, &signalHandler);
    signal(SIGTERM, &signalHandler);
    signal(SIGQUIT, &signalHandler);

    termios origTermios;
    tcgetattr(STDIN_FILENO, &origTermios);

    termios newTermios = origTermios;
    newTermios.c_lflag &= ~(ECHO | ICANON);
    tcsetattr(STDIN_FILENO, TCSANOW, &newTermios);

    int ret = 0;
    while (s_running) {
        s_currentPosition = -1.;
        nextSegmentStart = -1.;
        s_lastPositionFetched = -1;
        currentVideo = "";
        cc::mediaSession = "";
        cc::dest = "";

        if (ret != 0) {
            puts("Disconnected, sleeping and re-connecting");
            sleep(10);
        }
        sockaddr_in address{};


        if (!mdns::findChromecast(&address)) {
            ret = ENOENT;
            break;
        }

        // hide cursor
        printf("\033[?25l");
        s_currentStatus = "Connecting...";
        ret = loop(address);
    }

    printf("\033[?25h"); // re-enable cursor
    tcsetattr(STDIN_FILENO, TCSANOW, &origTermios);

    return ret;
}